

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

DBInfo __thiscall Clasp::Solver::reduceLinear(Solver *this,uint32 maxR,CmpScore *sc)

{
  Constraint *pCVar1;
  double dVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint32 uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  double dVar14;
  DBInfo DVar15;
  ScoreType a;
  ConstraintScore local_68;
  uint32 local_64;
  double local_60;
  ulong local_58;
  ConstraintScore local_4c;
  undefined1 local_48 [16];
  ConstraintScore local_34;
  
  local_64 = maxR;
  if ((this->learnts_).ebo_.size == 0) {
    dVar2 = 0.0;
    dVar14 = 0.0;
  }
  else {
    lVar11 = 0;
    uVar6 = 0;
    do {
      local_4c.rep = (*(this->learnts_).ebo_.buf[uVar6]->_vptr_Constraint[0xc])();
      uVar5 = ReduceStrategy::asScore(sc->rs,&local_4c);
      lVar11 = lVar11 + (ulong)uVar5;
      uVar9 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar9;
    } while (uVar9 != (this->learnts_).ebo_.size);
    auVar13._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar13._0_8_ = lVar11;
    auVar13._12_4_ = 0x45300000;
    dVar14 = auVar13._8_8_ - 1.9342813113834067e+25;
    dVar2 = dVar14 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  }
  local_48._8_4_ = SUB84(dVar14,0);
  local_48._0_8_ = dVar2;
  local_48._12_4_ = (int)((ulong)dVar14 >> 0x20);
  local_60 = (dVar2 / (double)(this->learnts_).ebo_.size) * 1.5;
  local_34.rep = 0x1fffff;
  uVar5 = ReduceStrategy::asScore(sc->rs,&local_34);
  if ((double)uVar5 < local_60) {
    local_60 = ((double)local_48._0_8_ / (double)(this->learnts_).ebo_.size + (double)uVar5) * 0.5;
  }
  if ((this->learnts_).ebo_.size == 0) {
    uVar5 = 0;
    uVar6 = 0;
  }
  else {
    local_58 = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_48._8_8_;
    local_48 = auVar3 << 0x40;
    uVar12 = 0;
    uVar10 = 0;
    do {
      pCVar1 = (this->learnts_).ebo_.buf[uVar12];
      local_68.rep = (*pCVar1->_vptr_Constraint[0xc])(pCVar1);
      uVar9 = (*pCVar1->_vptr_Constraint[0xb])(pCVar1,this);
      uVar5 = ReduceStrategy::asScore(sc->rs,&local_68);
      auVar13 = local_48;
      bVar4 = true;
      if ((double)uVar5 <= local_60) {
        uVar7 = local_68.rep >> 0x14 & 0x7f;
        if ((local_68.rep & 0x7f00000) == 0) {
          uVar7 = 0x7f;
        }
        bVar4 = uVar7 <= sc->glue;
      }
      if ((local_64 == 0 || (char)uVar9 != '\0') || (bVar4 != false)) {
LAB_0016db75:
        iVar8 = local_48._0_4_;
        local_48._4_4_ = 0;
        local_48._0_4_ = iVar8 + (uint)bVar4;
        local_48._8_8_ = auVar13._8_8_;
        local_58 = (ulong)((int)local_58 + (uVar9 & 0xff));
        uVar6 = (ulong)((int)uVar10 + 1);
        (this->learnts_).ebo_.buf[uVar10] = pCVar1;
        (*pCVar1->_vptr_Constraint[0xd])(pCVar1);
      }
      else {
        if ((local_68.rep >> 0x1b & 1) != 0) {
          uVar7 = local_68.rep >> 0x14 & 0x7f;
          if ((local_68.rep & 0x7f00000) == 0) {
            uVar7 = 0x7f;
          }
          if (uVar7 <= sc->freeze) goto LAB_0016db75;
        }
        local_64 = local_64 - 1;
        (*pCVar1->_vptr_Constraint[5])(pCVar1,this,1);
        uVar6 = uVar10;
      }
      uVar9 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar9;
      uVar10 = uVar6;
    } while (uVar9 != (this->learnts_).ebo_.size);
    uVar6 = uVar6 | local_58 << 0x20;
    uVar5 = local_48._0_4_;
  }
  DVar15.pinned = uVar5;
  DVar15.size = (int)uVar6;
  DVar15.locked = (int)(uVar6 >> 0x20);
  return DVar15;
}

Assistant:

Solver::DBInfo Solver::reduceLinear(uint32 maxR, const CmpScore& sc) {
	// compute average activity
	uint64 scoreSum = 0;
	for (LitVec::size_type i = 0; i != learnts_.size(); ++i) {
		scoreSum += sc.score(learnts_[i]->activity());
	}
	double avgAct = (scoreSum / (double) numLearntConstraints());
	// constraints with score > 1.5 times the average are "active"
	double scoreThresh = avgAct * 1.5;
	double scoreMax    = (double)sc.score(makeScore(Clasp::ACT_MAX, 1));
	if (scoreThresh > scoreMax) {
		scoreThresh = (scoreMax + (scoreSum / (double) numLearntConstraints())) / 2.0;
	}
	// remove up to maxR constraints but keep "active" and locked once
	DBInfo res = {0,0,0};
	typedef ConstraintScore ScoreType;
	for (LitVec::size_type i = 0; i != learnts_.size(); ++i) {
		Constraint* c = learnts_[i];
		ScoreType a   = c->activity();
		bool isLocked = c->locked(*this);
		bool isGlue   = sc.score(a) > scoreThresh || sc.isGlue(a);
		if (maxR == 0 || isLocked || isGlue || sc.isFrozen(a)) {
			res.pinned += isGlue;
			res.locked += isLocked;
			learnts_[res.size++] = c;
			c->decreaseActivity();
		}
		else {
			--maxR;
			c->destroy(this, true);
		}
	}
	return res;
}